

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

bool __thiscall CSocekt::flyd_open_listening_sockets(CSocekt *this)

{
  bool bVar1;
  uint __fd;
  int iVar2;
  int iVar3;
  Config *this_00;
  self *psVar4;
  LogStream *this_01;
  uint v;
  CSocekt *this_02;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  SourceFile file_05;
  SourceFile file_06;
  int reuseaddr;
  vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_> *local_1118;
  lp_listening_t p_listensocketitem;
  sockaddr local_1108;
  undefined1 local_10f8 [12];
  undefined1 local_10e8 [12];
  undefined1 local_10d8 [12];
  undefined1 local_10c8 [12];
  undefined1 local_10b8 [12];
  undefined1 local_10a8 [12];
  undefined1 local_1098 [12];
  undefined1 local_1088 [12];
  char strinfo [100];
  Logger local_1008;
  
  local_1108.sa_data[6] = '\0';
  local_1108.sa_data[7] = '\0';
  local_1108.sa_data[8] = '\0';
  local_1108.sa_data[9] = '\0';
  local_1108.sa_data[10] = '\0';
  local_1108.sa_data[0xb] = '\0';
  local_1108.sa_data[0xc] = '\0';
  local_1108.sa_data[0xd] = '\0';
  local_1108.sa_family = 2;
  local_1108.sa_data[0] = '\0';
  local_1108.sa_data[1] = '\0';
  local_1108.sa_data[2] = '\0';
  local_1108.sa_data[3] = '\0';
  local_1108.sa_data[4] = '\0';
  local_1108.sa_data[5] = '\0';
  local_1118 = &this->m_ListenSocketList;
  v = 0;
  do {
    if (this->m_ListenPortCount <= (int)v) {
      bVar1 = true;
      if ((this->m_ListenSocketList).
          super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->m_ListenSocketList).
          super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        muduo::Logger::SourceFile::SourceFile<100>
                  ((SourceFile *)local_10d8,
                   (char (*) [100])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                  );
        file_01._12_4_ = 0;
        file_01.data_ = (char *)local_10d8._0_8_;
        file_01.size_ = local_10d8._8_4_;
        muduo::Logger::Logger(&local_1008,file_01,0x116,ERROR);
        muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_18836);
LAB_001173af:
        muduo::Logger::~Logger(&local_1008);
LAB_00117523:
        bVar1 = false;
      }
      return bVar1;
    }
    __fd = socket(2,1,0);
    if (__fd == 0xffffffff) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_1088,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file_02._12_4_ = 0;
      file_02.data_ = (char *)local_1088._0_8_;
      file_02.size_ = local_1088._8_4_;
      muduo::Logger::Logger(&local_1008,file_02,0xd6,ERROR);
      psVar4 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_18763);
      muduo::LogStream::operator<<(psVar4,v);
      goto LAB_001173af;
    }
    reuseaddr = 1;
    this_02 = (CSocekt *)(ulong)__fd;
    iVar2 = setsockopt(__fd,1,2,&reuseaddr,4);
    if (iVar2 == -1) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_1098,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file_03._12_4_ = 0;
      file_03.data_ = (char *)local_1098._0_8_;
      file_03.size_ = local_1098._8_4_;
      muduo::Logger::Logger(&local_1008,file_03,0xe3,ERROR);
      psVar4 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_18779);
      muduo::LogStream::operator<<(psVar4,v);
LAB_0011750f:
      muduo::Logger::~Logger(&local_1008);
      close(__fd);
      goto LAB_00117523;
    }
    bVar1 = setnonblocking(this_02,__fd);
    if (!bVar1) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_10a8,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file_04._12_4_ = 0;
      file_04.data_ = (char *)local_10a8._0_8_;
      file_04.size_ = local_10a8._8_4_;
      muduo::Logger::Logger(&local_1008,file_04,0xeb,ERROR);
      psVar4 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_1878f);
      muduo::LogStream::operator<<(psVar4,v);
      goto LAB_0011750f;
    }
    strinfo[0] = '\0';
    sprintf(strinfo,"ListenPort%d",(ulong)v);
    this_00 = flyd::Singleton<flyd::Config>::getInstance();
    iVar2 = flyd::Config::GetIntDefault(this_00,strinfo,10000);
    if (muduo::g_logLevel < 2) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_10e8,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file._12_4_ = 0;
      file.data_ = (char *)local_10e8._0_8_;
      file.size_ = local_10e8._8_4_;
      muduo::Logger::Logger(&local_1008,file,0xf5,DEBUG,"flyd_open_listening_sockets");
      psVar4 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,"iport = ");
      muduo::LogStream::operator<<(psVar4,iVar2);
      muduo::Logger::~Logger(&local_1008);
    }
    local_1108.sa_data._0_2_ = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
    iVar3 = bind(__fd,&local_1108,0x10);
    if (iVar3 == -1) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_10b8,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file_05._12_4_ = 0;
      file_05.data_ = (char *)local_10b8._0_8_;
      file_05.size_ = local_10b8._8_4_;
      muduo::Logger::Logger(&local_1008,file_05,0xfd,ERROR);
      psVar4 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_187e7);
      muduo::LogStream::operator<<(psVar4,v);
      goto LAB_0011750f;
    }
    iVar3 = listen(__fd,0x1ff);
    if (iVar3 == -1) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_10c8,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file_06._12_4_ = 0;
      file_06.data_ = (char *)local_10c8._0_8_;
      file_06.size_ = local_10c8._8_4_;
      muduo::Logger::Logger(&local_1008,file_06,0x106,ERROR);
      psVar4 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_187fd);
      muduo::LogStream::operator<<(psVar4,v);
      goto LAB_0011750f;
    }
    p_listensocketitem = (lp_listening_t)operator_new(0x10);
    p_listensocketitem->connection = (lp_connection_t)0x0;
    p_listensocketitem->port = iVar2;
    p_listensocketitem->fd = __fd;
    if (muduo::g_logLevel < 3) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_10f8,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file_00._12_4_ = 0;
      file_00.data_ = (char *)local_10f8._0_8_;
      file_00.size_ = local_10f8._8_4_;
      muduo::Logger::Logger(&local_1008,file_00,0x111);
      psVar4 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_18836 + 0x15);
      this_01 = muduo::LogStream::operator<<(psVar4,iVar2);
      muduo::LogStream::operator<<(this_01,anon_var_dwarf_1881f);
      muduo::Logger::~Logger(&local_1008);
    }
    std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::push_back
              (local_1118,&p_listensocketitem);
    v = v + 1;
  } while( true );
}

Assistant:

bool CSocekt::flyd_open_listening_sockets()
{
    int                isock;                //socket
    struct sockaddr_in serv_addr;            //服务器的地址结构体
    int                iport;                //端口
    char               strinfo[100];         //临时字符串

    //初始化相关
    memset(&serv_addr,0,sizeof(serv_addr));  //先初始化一下
    serv_addr.sin_family = AF_INET;                //选择协议族为IPV4
    serv_addr.sin_addr.s_addr = htonl(INADDR_ANY); //监听本地所有的IP地址；INADDR_ANY表示的是一个服务器上所有的网卡（服务器可能不止一个网卡）多个本地ip地址都进行绑定端口号，进行侦听。

    //中途用到一些配置信息
  //  CConfig *p_config = CConfig::GetInstance();
    for(int i = 0; i < m_ListenPortCount; i++) //要监听这么多个端口
    {
        //参数1：AF_INET：使用ipv4协议，一般就这么写
        //参数2：SOCK_STREAM：使用TCP，表示可靠连接【相对还有一个UDP套接字，表示不可靠连接】
        //参数3：给0，固定用法，就这么记
        isock = socket(AF_INET,SOCK_STREAM,0); //系统函数，成功返回非负描述符，出错返回-1
        if(isock == -1)
        {
            LOG_ERROR << "CSocekt::Initialize()中socket()失败,i= " << i ;
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中socket()失败,i=%d.",i);
            //其实这里直接退出，那如果以往有成功创建的socket呢？就没得到释放吧，当然走到这里表示程序不正常，应该整个退出，也没必要释放了
            return false;
        }

        //setsockopt（）:设置一些套接字参数选项；
        //参数2：是表示级别，和参数3配套使用，也就是说，参数3如果确定了，参数2就确定了;
        //参数3：允许重用本地地址
        //设置 SO_REUSEADDR，目的第五章第三节讲解的非常清楚：主要是解决TIME_WAIT这个状态导致bind()失败的问题
        int reuseaddr = 1;  //1:打开对应的设置项
        if(setsockopt(isock,SOL_SOCKET, SO_REUSEADDR,(const void *) &reuseaddr, sizeof(reuseaddr)) == -1)
        {
            LOG_ERROR << "CSocekt::Initialize()中setsockopt(SO_REUSEADDR)失败,i= " << i ;
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中setsockopt(SO_REUSEADDR)失败,i=%d.",i);
            close(isock); //无需理会是否正常执行了
            return false;
        }
        //设置该socket为非阻塞
        if(setnonblocking(isock) == false)
        {
            LOG_ERROR << "CSocekt::Initialize()中setnonblocking()失败,i= " << i ;
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中setnonblocking()失败,i=%d.",i);
            close(isock);
            return false;
        }

        //设置本服务器要监听的地址和端口，这样客户端才能连接到该地址和端口并发送数据
        strinfo[0] = 0;
        sprintf(strinfo,"ListenPort%d",i);
        iport = Singleton<Config>::getInstance().GetIntDefault(strinfo, 10000);
        LOG_DEBUG << "iport = " << iport;
       // iport = p_config->GetIntDefault(strinfo,10000);
        serv_addr.sin_port = htons((in_port_t)iport);   //in_port_t其实就是uint16_t

        //绑定服务器地址结构体
        if(bind(isock, (struct sockaddr*)&serv_addr, sizeof(serv_addr)) == -1)
        {
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中bind()失败,i=%d.",i);
            LOG_ERROR << "CSocekt::Initialize()中bind()失败,i= " << i ;
            close(isock);
            return false;
        }

        //开始监听
        if(listen(isock,FLYD_LISTEN_BACKLOG) == -1)
        {
        //    ngx_log_stderr(errno,"CSocekt::Initialize()中listen()失败,i=%d.",i);
            LOG_ERROR << "CSocekt::Initialize()中listen()失败,i= " << i ;
            close(isock);
            return false;
        }

        //可以，放到列表里来
        lp_listening_t p_listensocketitem = new flyd_listening_t; //千万不要写错，注意前边类型是指针，后边类型是一个结构体
        memset(p_listensocketitem,0,sizeof(flyd_listening_t));      //注意后边用的是 ngx_listening_t而不是lpngx_listening_t
        p_listensocketitem->port = iport;                          //记录下所监听的端口号
        p_listensocketitem->fd   = isock;                          //套接字句柄保存下来
     //   ngx_log_error_core(NGX_LOG_INFO,0,"监听%d端口成功!",iport); //显示一些信息到日志中
        LOG_INFO << "监听" << iport << "端口成功!";
        m_ListenSocketList.push_back(p_listensocketitem);          //加入到队列中
    } //end for(int i = 0; i < m_ListenPortCount; i++)
    if(m_ListenSocketList.size() <= 0)  //不可能一个端口都不监听吧
    {
        LOG_ERROR << "一个端口都没有监听";
        return false;
    }
    return true;
}